

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O1

_Bool bitset_for_each(bitset_t *b,bitset_iterator iterator,void *ptr)

{
  long lVar1;
  _Bool _Var2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  bVar8 = b->arraysize == 0;
  if (!bVar8) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar4 = b->array[uVar6];
      do {
        uVar3 = uVar4;
        if (uVar3 == 0) {
          lVar5 = lVar5 + 0x40;
          break;
        }
        lVar1 = 0;
        if (uVar3 != 0) {
          for (; (uVar3 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        _Var2 = (*iterator)(lVar1 + lVar5,ptr);
        if (_Var2) {
          uVar4 = uVar3 - 1;
        }
        else {
          uVar4 = 0xffffffffffffffff;
        }
        uVar4 = uVar4 & uVar3;
      } while (_Var2);
      if (uVar3 != 0) {
        return bVar8;
      }
      uVar6 = uVar6 + 1;
      bVar7 = uVar6 < b->arraysize;
      bVar8 = !bVar7;
    } while (bVar7);
  }
  return bVar8;
}

Assistant:

inline bool bitset_for_each(const bitset_t *b, bitset_iterator iterator,
                            void *ptr) {
    size_t base = 0;
    for (size_t i = 0; i < b->arraysize; ++i) {
        uint64_t w = b->array[i];
        while (w != 0) {
            uint64_t t = w & (~w + 1);
            int r = roaring_trailing_zeroes(w);
            if (!iterator(r + base, ptr)) return false;
            w ^= t;
        }
        base += 64;
    }
    return true;
}